

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm.c
# Opt level: O2

int offset_compare(void *lhsv,void *rhsv)

{
  int iVar1;
  
  if (*lhsv < *rhsv) {
    iVar1 = -1;
  }
  else {
    if (*lhsv <= *rhsv) {
      return *(int *)((long)lhsv + 8) - *(int *)((long)rhsv + 8);
    }
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

static 
int offset_compare(const void* lhsv, const void* rhsv)
 {
     CMavail_period_ptr lhs = (CMavail_period_ptr) lhsv;
     CMavail_period_ptr rhs = (CMavail_period_ptr) rhsv;
     if (lhs->offset.tv_sec < rhs->offset.tv_sec)
	 return -1;
     if (lhs->offset.tv_sec > rhs->offset.tv_sec)
	 return 1;
     return lhs->offset.tv_usec - rhs->offset.tv_usec;
 }